

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::set(BoxArray *this,int i,Box *ibox)

{
  uint uVar1;
  Box *pBVar2;
  Box *in_RDX;
  int in_ESI;
  BATransformer *in_RDI;
  Box bx;
  int i_1;
  size_type in_stack_ffffffffffffff58;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *this_00;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_90;
  IndexType local_78;
  uint local_74;
  Box *local_70;
  Box *local_58;
  int local_4c;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *local_48;
  int local_3c;
  IndexType *local_38;
  int local_2c;
  IndexType *local_28;
  int local_1c;
  undefined4 local_18;
  int local_14;
  undefined1 *local_10;
  IndexType *local_8;
  
  local_70 = in_RDX;
  if (in_ESI == 0) {
    local_74 = (uint)Box::ixType(in_RDX);
    BATransformer::set_index_type(in_RDI,(IndexType)local_74);
  }
  local_58 = local_70;
  local_90.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)(local_70->smallend).vect;
  local_90.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)((local_70->smallend).vect + 2);
  local_90.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)((local_70->bigend).vect + 1);
  uVar1 = (local_70->btype).itype;
  this_00 = &local_90;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    local_38 = &local_78;
    local_3c = local_4c;
    local_2c = local_4c;
    local_1c = local_4c;
    if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) != 0) {
      local_10 = (undefined1 *)
                 ((long)&local_90.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish + 4);
      local_14 = local_4c;
      local_18 = 0xffffffff;
      *(int *)(local_10 + (long)local_4c * 4) = *(int *)(local_10 + (long)local_4c * 4) + -1;
    }
    local_28 = local_38;
  }
  local_8 = &local_78;
  local_78.itype = 0;
  local_48 = this_00;
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x125bc7c);
  pBVar2 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                     (this_00,in_stack_ffffffffffffff58);
  *(pointer *)(pBVar2->smallend).vect =
       local_90.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)((pBVar2->smallend).vect + 2) =
       local_90.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  *(pointer *)((pBVar2->bigend).vect + 1) =
       local_90.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (pBVar2->btype).itype = local_78.itype;
  return;
}

Assistant:

void
BoxArray::set (int i, const Box& ibox)
{
    BL_ASSERT(m_bat.is_simple() && crseRatio() == IntVect::TheUnitVector());
    if (i == 0) {
        m_bat.set_index_type(ibox.ixType());
    }
    m_ref->m_abox[i] = amrex::enclosedCells(ibox);
}